

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.h
# Opt level: O2

void sentencepiece::ParseCommandLineFlags(char *usage,int *argc,char ***argv,bool remove_arg)

{
  void *pvVar1;
  int *piVar2;
  undefined7 in_register_00000009;
  char **__dest;
  vector<char_*,_std::allocator<char_*>_> unused_args;
  void *local_30;
  void *local_28;
  
  absl::ParseCommandLine((int)&local_30,(char **)(ulong)(uint)*argc);
  if ((int)CONCAT71(in_register_00000009,remove_arg) != 0) {
    __dest = (char **)((long)*argv + ((long)*argc * 8 - ((long)local_28 - (long)local_30)));
    *argv = __dest;
    pvVar1 = local_28;
    if ((long)local_28 - (long)local_30 != 0) {
      memmove(__dest,local_30,(long)local_28 - (long)local_30);
      pvVar1 = local_30;
    }
    *argc = (int)((ulong)((long)local_28 - (long)pvVar1) >> 3);
  }
  piVar2 = (int *)absl::Flag<int>::value();
  sentencepiece::logging::SetMinLogLevel(*piVar2);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            ((_Vector_base<char_*,_std::allocator<char_*>_> *)&local_30);
  return;
}

Assistant:

inline void ParseCommandLineFlags(const char *usage, int *argc, char ***argv,
                                  bool remove_arg = true) {
  absl::SetProgramUsageMessage(*argv[0]);
  const auto unused_args = absl::ParseCommandLine(*argc, *argv);

  if (remove_arg) {
    char **argv_val = *argv;
    *argv = argv_val = argv_val + *argc - unused_args.size();
    std::copy(unused_args.begin(), unused_args.end(), argv_val);
    *argc = static_cast<int>(unused_args.size());
  }

  logging::SetMinLogLevel(absl::GetFlag(FLAGS_minloglevel));
}